

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowest_lexicography.cpp
# Opt level: O1

string * si9ma::LowestLexicography::lowest_lexicography
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *strs)

{
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  pointer pbVar1;
  pointer pcVar2;
  long lVar3;
  ulong uVar4;
  pointer pbVar5;
  string str;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  __first._M_current =
       (strs->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (strs->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    uVar4 = (long)__last._M_current - (long)__first._M_current >> 5;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::__cxx11::string_const&,std::__cxx11::string_const&)>>
              (__first,__last,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                )0x10d9fc);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::__cxx11::string_const&,std::__cxx11::string_const&)>>
              (__first,__last,
               (_Iter_comp_iter<bool_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                )0x10d9fc);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  pbVar5 = (strs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (strs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 != pbVar1) {
    do {
      pcVar2 = (pbVar5->_M_dataplus)._M_p;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pcVar2,pcVar2 + pbVar5->_M_string_length);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

string LowestLexicography::lowest_lexicography(vector<string> &strs) {

        std::sort(strs.begin(),strs.end(),cmp);

        string res = "";
        for (string str:strs){
            res += str;
        }

        return res;
    }